

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

uint64_t roaring64_bitmap_and_cardinality(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  int iVar1;
  leaf_t *leaf2;
  leaf_t *leaf1;
  int compare_result;
  art_iterator_t it2;
  art_iterator_t it1;
  uint64_t result;
  undefined7 in_stack_fffffffffffffeb8;
  art_key_chunk_t *in_stack_fffffffffffffec0;
  art_iterator_t *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  container_t *in_stack_fffffffffffffed8;
  art_key_chunk_t *local_120;
  art_iterator_t *local_98;
  uint64_t local_18;
  
  local_18 = 0;
  art_init_iterator((art_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
  art_init_iterator((art_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
  while (local_98 != (art_iterator_t *)0x0 && local_120 != (art_key_chunk_t *)0x0) {
    iVar1 = compare_high48(in_stack_fffffffffffffec0,
                           (art_key_chunk_t *)
                           CONCAT17(local_98 != (art_iterator_t *)0x0 &&
                                    local_120 != (art_key_chunk_t *)0x0,in_stack_fffffffffffffeb8));
    if (iVar1 == 0) {
      in_stack_fffffffffffffec0 = local_120;
      in_stack_fffffffffffffec8 = local_98;
      iVar1 = container_and_cardinality
                        (in_stack_fffffffffffffed8,'\0',local_98,(uint8_t)((ulong)local_120 >> 0x38)
                        );
      local_18 = (long)iVar1 + local_18;
      art_iterator_next((art_iterator_t *)0x10789d);
      art_iterator_next((art_iterator_t *)0x1078a7);
    }
    else if (iVar1 < 0) {
      art_iterator_lower_bound(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    else {
      art_iterator_lower_bound(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
  }
  return local_18;
}

Assistant:

uint64_t roaring64_bitmap_and_cardinality(const roaring64_bitmap_t *r1,
                                          const roaring64_bitmap_t *r2) {
    uint64_t result = 0;

    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL && it2.value != NULL) {
        // Cases:
        // 1. it1 <  it2 -> it1++
        // 2. it1 == it1 -> output cardinaltiy it1 & it2, it1++, it2++
        // 3. it1 >  it2 -> it2++
        int compare_result = compare_high48(it1.key, it2.key);
        if (compare_result == 0) {
            // Case 2: iterators at the same high key position.
            leaf_t *leaf1 = (leaf_t *)it1.value;
            leaf_t *leaf2 = (leaf_t *)it2.value;
            result +=
                container_and_cardinality(leaf1->container, leaf1->typecode,
                                          leaf2->container, leaf2->typecode);
            art_iterator_next(&it1);
            art_iterator_next(&it2);
        } else if (compare_result < 0) {
            // Case 1: it1 is before it2.
            art_iterator_lower_bound(&it1, it2.key);
        } else {
            // Case 3: it2 is before it1.
            art_iterator_lower_bound(&it2, it1.key);
        }
    }
    return result;
}